

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O0

VkImageViewType vkt::texture::util::textureTypeToImageViewType(Type type)

{
  VkImageViewType local_c;
  Type type_local;
  
  switch(type) {
  case TYPE_2D:
    local_c = VK_IMAGE_VIEW_TYPE_2D;
    break;
  case TYPE_CUBE_MAP:
    local_c = VK_IMAGE_VIEW_TYPE_CUBE;
    break;
  case TYPE_2D_ARRAY:
    local_c = VK_IMAGE_VIEW_TYPE_2D_ARRAY;
    break;
  case TYPE_3D:
    local_c = VK_IMAGE_VIEW_TYPE_3D;
    break;
  default:
    local_c = VK_IMAGE_VIEW_TYPE_2D;
  }
  return local_c;
}

Assistant:

VkImageViewType textureTypeToImageViewType (TextureBinding::Type type)
{
	switch (type)
	{
		case TextureBinding::TYPE_2D:			return VK_IMAGE_VIEW_TYPE_2D;
		case TextureBinding::TYPE_2D_ARRAY:		return VK_IMAGE_VIEW_TYPE_2D_ARRAY;
		case TextureBinding::TYPE_CUBE_MAP:		return VK_IMAGE_VIEW_TYPE_CUBE;
		case TextureBinding::TYPE_3D:			return VK_IMAGE_VIEW_TYPE_3D;
		default:
			DE_ASSERT(false);
	}

	return VK_IMAGE_VIEW_TYPE_2D;
}